

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetPchUseCompileOptions
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  _Base_ptr source;
  cmMakefile *pcVar1;
  size_type sVar2;
  string *arch_00;
  bool bVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar5;
  string pchFile;
  string pchHeader;
  string useOptVar;
  undefined1 local_160 [16];
  _Rb_tree_node_base local_150;
  undefined1 local_130 [48];
  string *local_100;
  cmAlphaNum local_f8;
  string *local_c8;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  string local_50;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 language,config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,arch
                );
  local_130._8_8_ = local_160._8_8_;
  local_130._0_8_ = local_130 + 0x10;
  if ((_Rb_tree_node_base *)local_160._0_8_ == &local_150) {
    local_130._24_8_ = local_150._M_parent;
  }
  else {
    local_130._0_8_ = local_160._0_8_;
  }
  local_160._8_8_ = (char *)0x0;
  local_150._M_color._0_1_ = '\0';
  local_130._32_8_ = "";
  local_160._0_8_ = &local_150;
  local_c8 = arch;
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchUseCompileOptions,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      *)local_130);
  _Var4 = pVar5.first._M_node;
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)&local_f8);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_130,"PCH_WARN_INVALID",(allocator<char> *)local_160);
    bVar3 = GetPropertyAsBool(this,(string *)local_130);
    source = _Var4._M_node + 2;
    std::__cxx11::string::~string((string *)local_130);
    local_100 = __return_storage_ptr__;
    if (bVar3) {
      pcVar1 = this->Makefile;
      local_130._0_8_ = &DAT_00000006;
      local_130._8_8_ = "CMAKE_";
      local_160._8_8_ = (language->_M_dataplus)._M_p;
      local_160._0_8_ = language->_M_string_length;
      cmStrCat<char[29]>((string *)&local_f8,(cmAlphaNum *)local_130,(cmAlphaNum *)local_160,
                         (char (*) [29])"_COMPILE_OPTIONS_INVALID_PCH");
      cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_f8);
      std::__cxx11::string::_M_assign((string *)source);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    local_130._8_8_ = (language->_M_dataplus)._M_p;
    local_130._0_8_ = language->_M_string_length;
    local_160._0_8_ = &DAT_00000018;
    local_160._8_8_ = "_COMPILE_OPTIONS_USE_PCH";
    cmStrCat<>(&local_c0,(cmAlphaNum *)local_130,(cmAlphaNum *)local_160);
    args = GetSafeProperty(this,&local_c0);
    local_130._8_8_ = *(undefined8 *)(_Var4._M_node + 2);
    local_130._0_8_ = _Var4._M_node[2]._M_parent;
    local_160._0_8_ = (_Rb_tree_node_base *)0x1;
    local_160._8_8_ = ";";
    sVar2 = args->_M_string_length;
    if (sVar2 == 0) {
      pcVar1 = this->Makefile;
      local_f8.View_._M_len = (size_t)&DAT_00000006;
      local_f8.View_._M_str = "CMAKE_";
      local_80.View_._M_len = local_c0._M_string_length;
      local_80.View_._M_str = local_c0._M_dataplus._M_p;
      cmStrCat<>(&local_a0,&local_f8,&local_80);
      args = cmMakefile::GetSafeDefinition(pcVar1,&local_a0);
    }
    cmStrCat<std::__cxx11::string>(&local_50,(cmAlphaNum *)local_130,(cmAlphaNum *)local_160,args);
    std::__cxx11::string::operator=((string *)source,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (sVar2 == 0) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    arch_00 = local_c8;
    __return_storage_ptr__ = local_100;
    GetPchHeader((string *)local_130,this,config,language,local_c8);
    GetPchFile((string *)local_160,this,config,language,arch_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"<PCH_HEADER>",(allocator<char> *)&local_80);
    cmsys::SystemTools::ReplaceString((string *)source,(string *)&local_f8,(string *)local_130);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"<PCH_FILE>",(allocator<char> *)&local_80);
    cmsys::SystemTools::ReplaceString((string *)source,(string *)&local_f8,(string *)local_160);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(_Var4._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchUseCompileOptions(
  const std::string& config, const std::string& language,
  const std::string& arch)
{
  const auto inserted = this->PchUseCompileOptions.insert(
    std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& useOptionList = inserted.first->second;

    if (this->GetPropertyAsBool("PCH_WARN_INVALID")) {
      useOptionList = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_INVALID_PCH"));
    }

    const std::string useOptVar =
      cmStrCat(language, "_COMPILE_OPTIONS_USE_PCH");

    std::string const& useOptionListProperty =
      this->GetSafeProperty(useOptVar);

    useOptionList = cmStrCat(
      useOptionList, ";",
      useOptionListProperty.empty()
        ? this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_", useOptVar))
        : useOptionListProperty);

    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    const std::string pchFile = this->GetPchFile(config, language, arch);

    cmSystemTools::ReplaceString(useOptionList, "<PCH_HEADER>", pchHeader);
    cmSystemTools::ReplaceString(useOptionList, "<PCH_FILE>", pchFile);
  }
  return inserted.first->second;
}